

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

bool __thiscall
QAbstractScrollAreaPrivate::canStartScrollingAt(QAbstractScrollAreaPrivate *this,QPoint *startPos)

{
  long lVar1;
  
  QWidget::childAt(*(QWidget **)
                    (*(long *)(*(long *)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8
                              + 8) + 0x2b0),startPos);
  lVar1 = QMetaObject::cast((QObject *)&QAbstractSlider::staticMetaObject);
  return lVar1 == 0;
}

Assistant:

bool QAbstractScrollAreaPrivate::canStartScrollingAt(const QPoint &startPos) const
{
    Q_Q(const QAbstractScrollArea);

    // don't start scrolling on a QAbstractSlider
    if (qobject_cast<QAbstractSlider *>(q->viewport()->childAt(startPos)))
        return false;

    return true;
}